

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

void __thiscall gl4cts::DirectStateAccess::Renderbuffers::StorageTest::Clean(StorageTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_rbo != 0) {
    (**(code **)(lVar2 + 0x460))(1,&this->m_rbo);
    this->m_rbo = 0;
  }
  if (this->m_fbo != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo);
    this->m_fbo = 0;
  }
  (**(code **)(lVar2 + 0x1c0))(0,0,0,0);
  (**(code **)(lVar2 + 0x1c8))(0x3ff0000000000000);
  (**(code **)(lVar2 + 0x208))(0);
  do {
    iVar1 = (**(code **)(lVar2 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void StorageTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release objects. */
	if (m_rbo)
	{
		gl.deleteRenderbuffers(1, &m_rbo);

		m_rbo = 0;
	}

	if (m_fbo)
	{
		gl.deleteFramebuffers(1, &m_fbo);

		m_fbo = 0;
	}

	/* Returning to default clear values. */
	gl.clearColor(0.f, 0.f, 0.f, 0.f);
	gl.clearDepth(1.f);
	gl.clearStencil(0);

	/* Errors clean up. */
	while (gl.getError())
		;
}